

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O2

bool __thiscall despot::Pocman::HearGhost(Pocman *this,PocmanState *pocstate)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    iVar1 = this->num_ghosts_;
    if (iVar1 <= lVar4) break;
    iVar3 = despot::Coord::ManhattanDistance
                      (*(undefined8 *)
                        ((pocstate->ghost_pos).
                         super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4 * 8),
                       *(undefined8 *)&pocstate->pocman_pos);
    lVar2 = lVar4 + 1;
  } while (this->hear_range_ < iVar3);
  return lVar4 < iVar1;
}

Assistant:

bool Pocman::HearGhost(const PocmanState& pocstate) const {
	for (int g = 0; g < num_ghosts_; g++)
		if (Coord::ManhattanDistance(pocstate.ghost_pos[g], pocstate.pocman_pos)
			<= hear_range_)
			return true;
	return false;
}